

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::TeeBranch::tryRead
          (TeeBranch *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  AsyncTee *this_00;
  Disposer DVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  Disposer *pDVar4;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  ImmediatePromiseNode<unsigned_long> *pIVar5;
  _func_int **in_R8;
  PromiseNode *ptrCopy;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar6;
  Promise<unsigned_long> PVar7;
  Fault f;
  ArrayPtr<unsigned_char> readBuffer;
  AsyncInputStream local_1c8;
  Disposer *pDStack_1c0;
  _func_int **local_1b0;
  _func_int **local_1a8;
  Disposer local_1a0;
  ArrayPtr<unsigned_char> local_198;
  Exception local_188;
  
  this_00 = *(AsyncTee **)((long)buffer + 0x10);
  uVar2 = (ulong)((uint)*(byte *)((long)buffer + 0x18) * 0x60);
  local_1a0._vptr_Disposer = (_func_int **)maxBytes;
  if ((&this_00->branches[0].ptr.isSet)[uVar2] == false) {
    local_1c8._vptr_AsyncInputStream = (_func_int **)0x0;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    _::Debug::Fault::init
              ((Fault *)&local_1c8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_1c8);
  }
  if (*(long *)((long)&this_00->branches[0].ptr.field_1 + uVar2 + 0x50) != 0) {
    local_1c8._vptr_AsyncInputStream = (_func_int **)0x0;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    _::Debug::Fault::init
              ((Fault *)&local_1c8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_1c8);
  }
  local_198.ptr = (uchar *)minBytes;
  local_198.size_ = (size_t)in_R8;
  pp_Var3 = (_func_int **)
            AsyncTee::Buffer::consume
                      ((Buffer *)((long)&this_00->branches[0].ptr.field_1 + uVar2),&local_198,
                       (size_t *)&local_1a0);
  DVar1._vptr_Disposer = local_1a0._vptr_Disposer;
  if (local_1a0._vptr_Disposer != (_func_int **)0x0) {
    if ((*(long *)((long)&this_00->branches[0].ptr.field_1 + uVar2 + 0x30) !=
         *(long *)((long)&this_00->branches[0].ptr.field_1 + uVar2 + 0x10)) ||
       ((this_00->stoppage).ptr.isSet != true)) {
      local_1a8 = (_func_int **)local_198.ptr;
      local_1b0 = (_func_int **)local_198.size_;
      pDVar4 = (Disposer *)operator_new(0x1c8);
      pDVar4[1]._vptr_Disposer = (_func_int **)0x0;
      pDVar4->_vptr_Disposer = (_func_int **)&PTR_onReady_0044bae8;
      pDVar4[2]._vptr_Disposer = (_func_int **)&PTR_fulfill_0044bb30;
      *(undefined1 *)&pDVar4[3]._vptr_Disposer = 0;
      *(undefined1 *)&pDVar4[0x2f]._vptr_Disposer = 0;
      *(undefined1 *)&pDVar4[0x31]._vptr_Disposer = 1;
      AsyncTee::SinkBase<unsigned_long>::SinkBase
                ((SinkBase<unsigned_long> *)(pDVar4 + 0x32),
                 (PromiseFulfiller<unsigned_long> *)(pDVar4 + 2),
                 (Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)
                 ((long)&this_00->branches[0].ptr.field_1 + uVar2 + 0x50));
      pDVar4[0x32]._vptr_Disposer = (_func_int **)&PTR_fill_0044bb90;
      pDVar4[0x35]._vptr_Disposer = local_1a8;
      pDVar4[0x36]._vptr_Disposer = local_1b0;
      pDVar4[0x37]._vptr_Disposer = DVar1._vptr_Disposer;
      pDVar4[0x38]._vptr_Disposer = pp_Var3;
      AsyncTee::ensurePulling(this_00);
      (this->super_AsyncInputStream)._vptr_AsyncInputStream =
           (_func_int **)
           &_::
            HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>>
            ::instance;
      (this->tee).disposer = pDVar4;
      pIVar5 = extraout_RDX_00;
      goto LAB_00313875;
    }
    if ((pp_Var3 == (_func_int **)0x0) && ((this_00->stoppage).ptr.field_1.value.tag != 1)) {
      Exception::Exception(&local_188,(Exception *)&(this_00->stoppage).ptr.field_1.value.field_1);
      heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_1c8,&local_188);
      (this->super_AsyncInputStream)._vptr_AsyncInputStream = local_1c8._vptr_AsyncInputStream;
      (this->tee).disposer = pDStack_1c0;
      Exception::~Exception(&local_188);
      pIVar5 = extraout_RDX;
      goto LAB_00313875;
    }
  }
  local_1c8._vptr_AsyncInputStream = pp_Var3;
  OVar6 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                    ((kj *)&local_188,(unsigned_long *)&local_1c8);
  pIVar5 = OVar6.ptr;
  (this->super_AsyncInputStream)._vptr_AsyncInputStream =
       (_func_int **)local_188.ownFile.content.ptr;
  (this->tee).disposer = (Disposer *)local_188.ownFile.content.size_;
LAB_00313875:
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar7.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    return tee->tryRead(branch, buffer, minBytes, maxBytes);
  }